

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Ref<embree::Geometry> *pRVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined4 uVar27;
  undefined1 (*pauVar28) [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 (*pauVar38) [16];
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  long lVar45;
  undefined1 (*pauVar46) [16];
  ulong uVar47;
  ulong uVar48;
  byte bVar49;
  int iVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [16];
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  uint uVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar69 [32];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar84;
  undefined1 auVar85 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27e0 [8];
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [8];
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined1 local_26a0 [32];
  undefined4 local_2680;
  undefined4 uStack_267c;
  undefined4 uStack_2678;
  undefined4 uStack_2674;
  undefined4 uStack_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [32];
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  undefined4 local_2620;
  undefined4 uStack_261c;
  undefined4 uStack_2618;
  undefined4 uStack_2614;
  undefined4 uStack_2610;
  undefined4 uStack_260c;
  undefined4 uStack_2608;
  undefined4 uStack_2604;
  undefined4 local_2600;
  undefined4 uStack_25fc;
  undefined4 uStack_25f8;
  undefined4 uStack_25f4;
  undefined4 uStack_25f0;
  undefined4 uStack_25ec;
  undefined4 uStack_25e8;
  undefined4 uStack_25e4;
  undefined4 local_25e0;
  undefined4 uStack_25dc;
  undefined4 uStack_25d8;
  undefined4 uStack_25d4;
  undefined4 uStack_25d0;
  undefined4 uStack_25cc;
  undefined4 uStack_25c8;
  undefined4 uStack_25c4;
  undefined1 local_25c0 [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined4 uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  undefined4 uStack_23c4;
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar38 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar56._4_4_ = fVar1;
  auVar56._0_4_ = fVar1;
  auVar56._8_4_ = fVar1;
  auVar56._12_4_ = fVar1;
  auVar56._16_4_ = fVar1;
  auVar56._20_4_ = fVar1;
  auVar56._24_4_ = fVar1;
  auVar56._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar57._4_4_ = fVar2;
  auVar57._0_4_ = fVar2;
  auVar57._8_4_ = fVar2;
  auVar57._12_4_ = fVar2;
  auVar57._16_4_ = fVar2;
  auVar57._20_4_ = fVar2;
  auVar57._24_4_ = fVar2;
  auVar57._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar58._4_4_ = fVar3;
  auVar58._0_4_ = fVar3;
  auVar58._8_4_ = fVar3;
  auVar58._12_4_ = fVar3;
  auVar58._16_4_ = fVar3;
  auVar58._20_4_ = fVar3;
  auVar58._24_4_ = fVar3;
  auVar58._28_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar50 = (tray->tfar).field_0.i[k];
  auVar86 = ZEXT3264(CONCAT428(iVar50,CONCAT424(iVar50,CONCAT420(iVar50,CONCAT416(iVar50,CONCAT412(
                                                  iVar50,CONCAT48(iVar50,CONCAT44(iVar50,iVar50)))))
                                               )));
  auVar64._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar64._8_4_ = -fVar1;
  auVar64._12_4_ = -fVar1;
  auVar64._16_4_ = -fVar1;
  auVar64._20_4_ = -fVar1;
  auVar64._24_4_ = -fVar1;
  auVar64._28_4_ = -fVar1;
  auVar65._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar65._8_4_ = -fVar2;
  auVar65._12_4_ = -fVar2;
  auVar65._16_4_ = -fVar2;
  auVar65._20_4_ = -fVar2;
  auVar65._24_4_ = -fVar2;
  auVar65._28_4_ = -fVar2;
  local_2680 = 0x80000000;
  uStack_267c = 0x80000000;
  uStack_2678 = 0x80000000;
  uStack_2674 = 0x80000000;
  uStack_2670 = 0x80000000;
  uStack_266c = 0x80000000;
  uStack_2668 = 0x80000000;
  uStack_2664 = 0x80000000;
  auVar66._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar66._8_4_ = -fVar3;
  auVar66._12_4_ = -fVar3;
  auVar66._16_4_ = -fVar3;
  auVar66._20_4_ = -fVar3;
  auVar66._24_4_ = -fVar3;
  auVar66._28_4_ = -fVar3;
  iVar50 = (tray->tnear).field_0.i[k];
  auVar67._4_4_ = iVar50;
  auVar67._0_4_ = iVar50;
  auVar67._8_4_ = iVar50;
  auVar67._12_4_ = iVar50;
  auVar67._16_4_ = iVar50;
  auVar67._20_4_ = iVar50;
  auVar67._24_4_ = iVar50;
  auVar67._28_4_ = iVar50;
  local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
  local_26a0._0_16_ = mm_lookupmask_ps._0_16_;
  auVar76._8_4_ = 0x3f800000;
  auVar76._0_8_ = 0x3f8000003f800000;
  auVar76._12_4_ = 0x3f800000;
  auVar76._16_4_ = 0x3f800000;
  auVar76._20_4_ = 0x3f800000;
  auVar76._24_4_ = 0x3f800000;
  auVar76._28_4_ = 0x3f800000;
  auVar63._8_4_ = 0xbf800000;
  auVar63._0_8_ = 0xbf800000bf800000;
  auVar63._12_4_ = 0xbf800000;
  auVar63._16_4_ = 0xbf800000;
  auVar63._20_4_ = 0xbf800000;
  auVar63._24_4_ = 0xbf800000;
  auVar63._28_4_ = 0xbf800000;
  _local_26c0 = vblendvps_avx(auVar76,auVar63,local_26a0);
LAB_005d9128:
  do {
    pauVar28 = pauVar38 + -1;
    pauVar38 = pauVar38 + -1;
    if (*(float *)(*pauVar28 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      pauVar28 = pauVar38;
      uVar53 = *(ulong *)*pauVar38;
      while (pauVar38 = pauVar28, (uVar53 & 8) == 0) {
        auVar59 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar43),auVar64,auVar56);
        auVar68 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar47),auVar65,auVar57);
        auVar63 = vpmaxsd_avx2(ZEXT1632(auVar59),ZEXT1632(auVar68));
        auVar59 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar48),auVar66,auVar58);
        auVar76 = vpmaxsd_avx2(ZEXT1632(auVar59),auVar67);
        local_2580 = vpmaxsd_avx2(auVar63,auVar76);
        auVar59 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + (uVar43 ^ 0x20)),auVar64,
                                  auVar56);
        auVar68 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + (uVar47 ^ 0x20)),auVar65,
                                  auVar57);
        auVar63 = vpminsd_avx2(ZEXT1632(auVar59),ZEXT1632(auVar68));
        auVar59 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + (uVar48 ^ 0x20)),auVar66,
                                  auVar58);
        auVar76 = vpminsd_avx2(ZEXT1632(auVar59),auVar86._0_32_);
        auVar63 = vpminsd_avx2(auVar63,auVar76);
        auVar63 = vpcmpgtd_avx2(local_2580,auVar63);
        iVar50 = vmovmskps_avx(auVar63);
        if (iVar50 == 0xff) {
          if (pauVar38 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005d9128;
        }
        bVar49 = ~(byte)iVar50;
        uVar54 = uVar53 & 0xfffffffffffffff0;
        lVar55 = 0;
        for (uVar53 = (ulong)bVar49; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
          lVar55 = lVar55 + 1;
        }
        uVar53 = *(ulong *)(uVar54 + lVar55 * 8);
        uVar44 = bVar49 - 1 & (uint)bVar49;
        uVar51 = (ulong)uVar44;
        pauVar28 = pauVar38;
        if (uVar44 != 0) {
          uVar39 = *(uint *)(local_2580 + lVar55 * 4);
          lVar55 = 0;
          for (; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
            lVar55 = lVar55 + 1;
          }
          uVar44 = uVar44 - 1 & uVar44;
          uVar41 = (ulong)uVar44;
          uVar51 = *(ulong *)(uVar54 + lVar55 * 8);
          uVar40 = *(uint *)(local_2580 + lVar55 * 4);
          if (uVar44 == 0) {
            pauVar28 = pauVar38 + 1;
            if (uVar39 < uVar40) {
              *(ulong *)*pauVar38 = uVar51;
              *(uint *)(*pauVar38 + 8) = uVar40;
            }
            else {
              *(ulong *)*pauVar38 = uVar53;
              *(uint *)(*pauVar38 + 8) = uVar39;
              uVar53 = uVar51;
            }
          }
          else {
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar53;
            auVar59 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar39));
            auVar68._8_8_ = 0;
            auVar68._0_8_ = uVar51;
            auVar68 = vpunpcklqdq_avx(auVar68,ZEXT416(uVar40));
            lVar55 = 0;
            for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
              lVar55 = lVar55 + 1;
            }
            uVar44 = uVar44 - 1 & uVar44;
            uVar53 = (ulong)uVar44;
            auVar75._8_8_ = 0;
            auVar75._0_8_ = *(ulong *)(uVar54 + lVar55 * 8);
            auVar60 = vpunpcklqdq_avx(auVar75,ZEXT416(*(uint *)(local_2580 + lVar55 * 4)));
            auVar75 = vpcmpgtd_avx(auVar68,auVar59);
            if (uVar44 == 0) {
              auVar78 = vpshufd_avx(auVar75,0xaa);
              auVar75 = vblendvps_avx(auVar68,auVar59,auVar78);
              auVar59 = vblendvps_avx(auVar59,auVar68,auVar78);
              auVar68 = vpcmpgtd_avx(auVar60,auVar75);
              auVar78 = vpshufd_avx(auVar68,0xaa);
              auVar68 = vblendvps_avx(auVar60,auVar75,auVar78);
              auVar75 = vblendvps_avx(auVar75,auVar60,auVar78);
              auVar60 = vpcmpgtd_avx(auVar75,auVar59);
              auVar78 = vpshufd_avx(auVar60,0xaa);
              auVar60 = vblendvps_avx(auVar75,auVar59,auVar78);
              auVar59 = vblendvps_avx(auVar59,auVar75,auVar78);
              *pauVar38 = auVar59;
              pauVar38[1] = auVar60;
              uVar53 = auVar68._0_8_;
              pauVar28 = pauVar38 + 2;
            }
            else {
              lVar55 = 0;
              for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
                lVar55 = lVar55 + 1;
              }
              uVar44 = uVar44 - 1 & uVar44;
              uVar51 = (ulong)uVar44;
              auVar78._8_8_ = 0;
              auVar78._0_8_ = *(ulong *)(uVar54 + lVar55 * 8);
              auVar78 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_2580 + lVar55 * 4)));
              if (uVar44 == 0) {
                auVar15 = vpshufd_avx(auVar75,0xaa);
                auVar75 = vblendvps_avx(auVar68,auVar59,auVar15);
                auVar59 = vblendvps_avx(auVar59,auVar68,auVar15);
                auVar68 = vpcmpgtd_avx(auVar78,auVar60);
                auVar15 = vpshufd_avx(auVar68,0xaa);
                auVar68 = vblendvps_avx(auVar78,auVar60,auVar15);
                auVar60 = vblendvps_avx(auVar60,auVar78,auVar15);
                auVar78 = vpcmpgtd_avx(auVar60,auVar59);
                auVar15 = vpshufd_avx(auVar78,0xaa);
                auVar78 = vblendvps_avx(auVar60,auVar59,auVar15);
                auVar59 = vblendvps_avx(auVar59,auVar60,auVar15);
                auVar60 = vpcmpgtd_avx(auVar68,auVar75);
                auVar15 = vpshufd_avx(auVar60,0xaa);
                auVar60 = vblendvps_avx(auVar68,auVar75,auVar15);
                auVar68 = vblendvps_avx(auVar75,auVar68,auVar15);
                auVar75 = vpcmpgtd_avx(auVar78,auVar68);
                auVar15 = vpshufd_avx(auVar75,0xaa);
                auVar75 = vblendvps_avx(auVar78,auVar68,auVar15);
                auVar68 = vblendvps_avx(auVar68,auVar78,auVar15);
                *pauVar38 = auVar59;
                pauVar38[1] = auVar68;
                pauVar38[2] = auVar75;
                uVar53 = auVar60._0_8_;
                pauVar28 = pauVar38 + 3;
              }
              else {
                *pauVar38 = auVar59;
                pauVar38[1] = auVar68;
                pauVar38[2] = auVar60;
                pauVar38[3] = auVar78;
                lVar55 = 0x30;
                do {
                  lVar45 = lVar55;
                  lVar55 = 0;
                  for (uVar53 = uVar51; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000
                      ) {
                    lVar55 = lVar55 + 1;
                  }
                  uVar53 = *(ulong *)(uVar54 + lVar55 * 8);
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = uVar53;
                  auVar59 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_2580 + lVar55 * 4)));
                  *(undefined1 (*) [16])(pauVar38[1] + lVar45) = auVar59;
                  uVar51 = uVar51 - 1 & uVar51;
                  lVar55 = lVar45 + 0x10;
                } while (uVar51 != 0);
                pauVar28 = (undefined1 (*) [16])(pauVar38[1] + lVar45);
                if (lVar45 + 0x10 != 0) {
                  lVar55 = 0x10;
                  pauVar52 = pauVar38;
                  do {
                    uVar5 = *(undefined4 *)pauVar52[1];
                    uVar4 = *(undefined4 *)(pauVar52[1] + 4);
                    uVar44 = *(uint *)(pauVar52[1] + 8);
                    uVar27 = *(undefined4 *)(pauVar52[1] + 0xc);
                    pauVar52 = pauVar52 + 1;
                    lVar45 = lVar55;
                    do {
                      if (uVar44 <= *(uint *)(pauVar38[-1] + lVar45 + 8)) {
                        pauVar46 = (undefined1 (*) [16])(*pauVar38 + lVar45);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar38 + lVar45) =
                           *(undefined1 (*) [16])(pauVar38[-1] + lVar45);
                      lVar45 = lVar45 + -0x10;
                      pauVar46 = pauVar38;
                    } while (lVar45 != 0);
                    *(undefined4 *)*pauVar46 = uVar5;
                    *(undefined4 *)(*pauVar46 + 4) = uVar4;
                    *(uint *)(*pauVar46 + 8) = uVar44;
                    *(undefined4 *)(*pauVar46 + 0xc) = uVar27;
                    lVar55 = lVar55 + 0x10;
                  } while (pauVar28 != pauVar52);
                  uVar53 = *(ulong *)*pauVar28;
                }
              }
            }
          }
        }
      }
      uVar54 = (ulong)((uint)uVar53 & 0xf);
      if (uVar54 != 8) {
        local_25e0 = *(undefined4 *)(ray + k * 4);
        uStack_25dc = local_25e0;
        uStack_25d8 = local_25e0;
        uStack_25d4 = local_25e0;
        uStack_25d0 = local_25e0;
        uStack_25cc = local_25e0;
        uStack_25c8 = local_25e0;
        uStack_25c4 = local_25e0;
        local_2600 = *(undefined4 *)(ray + k * 4 + 0x10);
        uStack_25fc = local_2600;
        uStack_25f8 = local_2600;
        uStack_25f4 = local_2600;
        uStack_25f0 = local_2600;
        uStack_25ec = local_2600;
        uStack_25e8 = local_2600;
        uStack_25e4 = local_2600;
        local_2620 = *(undefined4 *)(ray + k * 4 + 0x20);
        uStack_261c = local_2620;
        uStack_2618 = local_2620;
        uStack_2614 = local_2620;
        uStack_2610 = local_2620;
        uStack_260c = local_2620;
        uStack_2608 = local_2620;
        uStack_2604 = local_2620;
        fVar1 = *(float *)(ray + k * 4 + 0x40);
        fVar2 = *(float *)(ray + k * 4 + 0x50);
        uVar53 = uVar53 & 0xfffffffffffffff0;
        local_2640 = *(float *)(ray + k * 4 + 0x60);
        fStack_263c = local_2640;
        fStack_2638 = local_2640;
        fStack_2634 = local_2640;
        fStack_2630 = local_2640;
        fStack_262c = local_2640;
        fStack_2628 = local_2640;
        fStack_2624 = local_2640;
        lVar55 = 0;
        do {
          lVar42 = lVar55 * 0xe0;
          lVar45 = uVar53 + 0xd0 + lVar42;
          local_25a0 = *(undefined8 *)(lVar45 + 0x10);
          uStack_2598 = *(undefined8 *)(lVar45 + 0x18);
          lVar45 = uVar53 + 0xc0 + lVar42;
          local_2700 = *(undefined8 *)(lVar45 + 0x10);
          uStack_26f8 = *(undefined8 *)(lVar45 + 0x18);
          uStack_26f0 = local_2700;
          uStack_26e8 = uStack_26f8;
          uStack_2590 = local_25a0;
          uStack_2588 = uStack_2598;
          auVar77._16_16_ = *(undefined1 (*) [16])(uVar53 + 0x60 + lVar42);
          auVar77._0_16_ = *(undefined1 (*) [16])(uVar53 + lVar42);
          auVar91._16_16_ = *(undefined1 (*) [16])(uVar53 + 0x70 + lVar42);
          auVar91._0_16_ = *(undefined1 (*) [16])(uVar53 + 0x10 + lVar42);
          auVar90._16_16_ = *(undefined1 (*) [16])(uVar53 + 0x80 + lVar42);
          auVar90._0_16_ = *(undefined1 (*) [16])(uVar53 + 0x20 + lVar42);
          auVar59 = *(undefined1 (*) [16])(uVar53 + 0x30 + lVar42);
          auVar69._16_16_ = auVar59;
          auVar69._0_16_ = auVar59;
          auVar59 = *(undefined1 (*) [16])(uVar53 + 0x40 + lVar42);
          auVar61._16_16_ = auVar59;
          auVar61._0_16_ = auVar59;
          auVar59 = *(undefined1 (*) [16])(uVar53 + 0x50 + lVar42);
          auVar83._16_16_ = auVar59;
          auVar83._0_16_ = auVar59;
          auVar68 = *(undefined1 (*) [16])(uVar53 + 0x90 + lVar42);
          auVar85._16_16_ = auVar68;
          auVar85._0_16_ = auVar68;
          auVar68 = *(undefined1 (*) [16])(uVar53 + 0xa0 + lVar42);
          auVar79._16_16_ = auVar68;
          auVar79._0_16_ = auVar68;
          lVar42 = uVar53 + 0xb0 + lVar42;
          pauVar28 = (undefined1 (*) [16])(lVar42 + 0x10);
          uStack_27d0 = *(undefined8 *)*pauVar28;
          _local_27e0 = *pauVar28;
          uStack_27c8 = *(undefined8 *)(lVar42 + 0x18);
          auVar76 = vsubps_avx(auVar77,auVar69);
          auVar63 = vsubps_avx(auVar91,auVar61);
          auVar10 = vsubps_avx(auVar90,auVar83);
          local_25c0 = vsubps_avx(auVar85,auVar77);
          auVar11 = vsubps_avx(auVar79,auVar91);
          auVar12 = vsubps_avx(_local_27e0,auVar90);
          auVar13._4_4_ = auVar12._4_4_ * auVar63._4_4_;
          auVar13._0_4_ = auVar12._0_4_ * auVar63._0_4_;
          auVar13._8_4_ = auVar12._8_4_ * auVar63._8_4_;
          auVar13._12_4_ = auVar12._12_4_ * auVar63._12_4_;
          auVar13._16_4_ = auVar12._16_4_ * auVar63._16_4_;
          auVar13._20_4_ = auVar12._20_4_ * auVar63._20_4_;
          auVar13._24_4_ = auVar12._24_4_ * auVar63._24_4_;
          auVar13._28_4_ = auVar59._12_4_;
          auVar60 = vfmsub231ps_fma(auVar13,auVar11,auVar10);
          auVar14._4_4_ = auVar10._4_4_ * local_25c0._4_4_;
          auVar14._0_4_ = auVar10._0_4_ * local_25c0._0_4_;
          auVar14._8_4_ = auVar10._8_4_ * local_25c0._8_4_;
          auVar14._12_4_ = auVar10._12_4_ * local_25c0._12_4_;
          auVar14._16_4_ = auVar10._16_4_ * local_25c0._16_4_;
          auVar14._20_4_ = auVar10._20_4_ * local_25c0._20_4_;
          auVar14._24_4_ = auVar10._24_4_ * local_25c0._24_4_;
          auVar14._28_4_ = auVar63._28_4_;
          auVar78 = vfmsub231ps_fma(auVar14,auVar12,auVar76);
          auVar37._4_4_ = uStack_25dc;
          auVar37._0_4_ = local_25e0;
          auVar37._8_4_ = uStack_25d8;
          auVar37._12_4_ = uStack_25d4;
          auVar37._16_4_ = uStack_25d0;
          auVar37._20_4_ = uStack_25cc;
          auVar37._24_4_ = uStack_25c8;
          auVar37._28_4_ = uStack_25c4;
          local_2660 = vsubps_avx(auVar77,auVar37);
          auVar36._4_4_ = uStack_25fc;
          auVar36._0_4_ = local_2600;
          auVar36._8_4_ = uStack_25f8;
          auVar36._12_4_ = uStack_25f4;
          auVar36._16_4_ = uStack_25f0;
          auVar36._20_4_ = uStack_25ec;
          auVar36._24_4_ = uStack_25e8;
          auVar36._28_4_ = uStack_25e4;
          auVar13 = vsubps_avx(auVar91,auVar36);
          auVar35._4_4_ = uStack_261c;
          auVar35._0_4_ = local_2620;
          auVar35._8_4_ = uStack_2618;
          auVar35._12_4_ = uStack_2614;
          auVar35._16_4_ = uStack_2610;
          auVar35._20_4_ = uStack_260c;
          auVar35._24_4_ = uStack_2608;
          auVar35._28_4_ = uStack_2604;
          auVar14 = vsubps_avx(auVar90,auVar35);
          auVar31._4_4_ = fVar1;
          auVar31._0_4_ = fVar1;
          auVar31._8_4_ = fVar1;
          auVar31._12_4_ = fVar1;
          auVar31._16_4_ = fVar1;
          auVar31._20_4_ = fVar1;
          auVar31._24_4_ = fVar1;
          auVar31._28_4_ = fVar1;
          auVar17._4_4_ = fVar1 * auVar13._4_4_;
          auVar17._0_4_ = fVar1 * auVar13._0_4_;
          auVar17._8_4_ = fVar1 * auVar13._8_4_;
          auVar17._12_4_ = fVar1 * auVar13._12_4_;
          auVar17._16_4_ = fVar1 * auVar13._16_4_;
          auVar17._20_4_ = fVar1 * auVar13._20_4_;
          auVar17._24_4_ = fVar1 * auVar13._24_4_;
          auVar17._28_4_ = auVar13._28_4_;
          auVar29._4_4_ = fVar2;
          auVar29._0_4_ = fVar2;
          auVar29._8_4_ = fVar2;
          auVar29._12_4_ = fVar2;
          auVar29._16_4_ = fVar2;
          auVar29._20_4_ = fVar2;
          auVar29._24_4_ = fVar2;
          auVar29._28_4_ = fVar2;
          auVar59 = vfmsub231ps_fma(auVar17,local_2660,auVar29);
          auVar18._4_4_ = auVar12._4_4_ * auVar59._4_4_;
          auVar18._0_4_ = auVar12._0_4_ * auVar59._0_4_;
          auVar18._8_4_ = auVar12._8_4_ * auVar59._8_4_;
          auVar18._12_4_ = auVar12._12_4_ * auVar59._12_4_;
          auVar18._16_4_ = auVar12._16_4_ * 0.0;
          auVar18._20_4_ = auVar12._20_4_ * 0.0;
          auVar18._24_4_ = auVar12._24_4_ * 0.0;
          auVar18._28_4_ = auVar12._28_4_;
          auVar12._4_4_ = auVar10._4_4_ * auVar59._4_4_;
          auVar12._0_4_ = auVar10._0_4_ * auVar59._0_4_;
          auVar12._8_4_ = auVar10._8_4_ * auVar59._8_4_;
          auVar12._12_4_ = auVar10._12_4_ * auVar59._12_4_;
          auVar12._16_4_ = auVar10._16_4_ * 0.0;
          auVar12._20_4_ = auVar10._20_4_ * 0.0;
          auVar12._24_4_ = auVar10._24_4_ * 0.0;
          auVar12._28_4_ = auVar10._28_4_;
          auVar34._4_4_ = fStack_263c;
          auVar34._0_4_ = local_2640;
          auVar34._8_4_ = fStack_2638;
          auVar34._12_4_ = fStack_2634;
          auVar34._16_4_ = fStack_2630;
          auVar34._20_4_ = fStack_262c;
          auVar34._24_4_ = fStack_2628;
          auVar34._28_4_ = fStack_2624;
          auVar10._4_4_ = fStack_263c * local_2660._4_4_;
          auVar10._0_4_ = local_2640 * local_2660._0_4_;
          auVar10._8_4_ = fStack_2638 * local_2660._8_4_;
          auVar10._12_4_ = fStack_2634 * local_2660._12_4_;
          auVar10._16_4_ = fStack_2630 * local_2660._16_4_;
          auVar10._20_4_ = fStack_262c * local_2660._20_4_;
          auVar10._24_4_ = fStack_2628 * local_2660._24_4_;
          auVar10._28_4_ = local_2660._28_4_;
          auVar68 = vfmsub231ps_fma(auVar10,auVar14,auVar31);
          auVar59 = vfmadd231ps_fma(auVar18,ZEXT1632(auVar68),auVar11);
          auVar19._4_4_ = auVar76._4_4_ * auVar11._4_4_;
          auVar19._0_4_ = auVar76._0_4_ * auVar11._0_4_;
          auVar19._8_4_ = auVar76._8_4_ * auVar11._8_4_;
          auVar19._12_4_ = auVar76._12_4_ * auVar11._12_4_;
          auVar19._16_4_ = auVar76._16_4_ * auVar11._16_4_;
          auVar19._20_4_ = auVar76._20_4_ * auVar11._20_4_;
          auVar19._24_4_ = auVar76._24_4_ * auVar11._24_4_;
          auVar19._28_4_ = auVar11._28_4_;
          auVar15 = vfmsub231ps_fma(auVar19,local_25c0,auVar63);
          auVar68 = vfmadd231ps_fma(auVar12,auVar63,ZEXT1632(auVar68));
          auVar30._4_4_ = fVar2;
          auVar30._0_4_ = fVar2;
          auVar30._8_4_ = fVar2;
          auVar30._12_4_ = fVar2;
          auVar30._16_4_ = fVar2;
          auVar30._20_4_ = fVar2;
          auVar30._24_4_ = fVar2;
          auVar30._28_4_ = fVar2;
          auVar11._4_4_ = fVar2 * auVar14._4_4_;
          auVar11._0_4_ = fVar2 * auVar14._0_4_;
          auVar11._8_4_ = fVar2 * auVar14._8_4_;
          auVar11._12_4_ = fVar2 * auVar14._12_4_;
          auVar11._16_4_ = fVar2 * auVar14._16_4_;
          auVar11._20_4_ = fVar2 * auVar14._20_4_;
          auVar11._24_4_ = fVar2 * auVar14._24_4_;
          auVar11._28_4_ = auVar14._28_4_;
          auVar16 = vfmsub231ps_fma(auVar11,auVar34,auVar13);
          fVar3 = auVar15._0_4_;
          fVar7 = auVar15._4_4_;
          auVar20._4_4_ = fStack_263c * fVar7;
          auVar20._0_4_ = local_2640 * fVar3;
          fVar8 = auVar15._8_4_;
          auVar20._8_4_ = fStack_2638 * fVar8;
          fVar9 = auVar15._12_4_;
          auVar20._12_4_ = fStack_2634 * fVar9;
          auVar20._16_4_ = fStack_2630 * 0.0;
          auVar20._20_4_ = fStack_262c * 0.0;
          auVar20._24_4_ = fStack_2628 * 0.0;
          auVar20._28_4_ = fStack_2624;
          auVar75 = vfmadd231ps_fma(auVar20,auVar30,ZEXT1632(auVar78));
          auVar32._4_4_ = fVar1;
          auVar32._0_4_ = fVar1;
          auVar32._8_4_ = fVar1;
          auVar32._12_4_ = fVar1;
          auVar32._16_4_ = fVar1;
          auVar32._20_4_ = fVar1;
          auVar32._24_4_ = fVar1;
          auVar32._28_4_ = fVar1;
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar32,ZEXT1632(auVar60));
          auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),ZEXT1632(auVar16),local_25c0);
          auVar33._4_4_ = uStack_267c;
          auVar33._0_4_ = local_2680;
          auVar33._8_4_ = uStack_2678;
          auVar33._12_4_ = uStack_2674;
          auVar33._16_4_ = uStack_2670;
          auVar33._20_4_ = uStack_266c;
          auVar33._24_4_ = uStack_2668;
          auVar33._28_4_ = uStack_2664;
          auVar63 = vandps_avx(ZEXT1632(auVar75),auVar33);
          uVar44 = auVar63._0_4_;
          local_2580._0_4_ = (float)(uVar44 ^ auVar59._0_4_);
          uVar39 = auVar63._4_4_;
          local_2580._4_4_ = (float)(uVar39 ^ auVar59._4_4_);
          uVar40 = auVar63._8_4_;
          local_2580._8_4_ = (float)(uVar40 ^ auVar59._8_4_);
          uVar70 = auVar63._12_4_;
          local_2580._12_4_ = (float)(uVar70 ^ auVar59._12_4_);
          fVar71 = auVar63._16_4_;
          local_2580._16_4_ = fVar71;
          fVar72 = auVar63._20_4_;
          local_2580._20_4_ = fVar72;
          fVar73 = auVar63._24_4_;
          local_2580._24_4_ = fVar73;
          fVar74 = auVar63._28_4_;
          local_2580._28_4_ = fVar74;
          auVar59 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar76,ZEXT1632(auVar16));
          local_2560._0_4_ = (float)(uVar44 ^ auVar59._0_4_);
          local_2560._4_4_ = (float)(uVar39 ^ auVar59._4_4_);
          local_2560._8_4_ = (float)(uVar40 ^ auVar59._8_4_);
          local_2560._12_4_ = (float)(uVar70 ^ auVar59._12_4_);
          local_2560._16_4_ = fVar71;
          local_2560._20_4_ = fVar72;
          local_2560._24_4_ = fVar73;
          local_2560._28_4_ = fVar74;
          auVar63 = vcmpps_avx(local_2580,ZEXT832(0) << 0x20,5);
          auVar76 = vcmpps_avx(local_2560,ZEXT832(0) << 0x20,5);
          auVar63 = vandps_avx(auVar76,auVar63);
          auVar80._8_4_ = 0x7fffffff;
          auVar80._0_8_ = 0x7fffffff7fffffff;
          auVar80._12_4_ = 0x7fffffff;
          auVar80._16_4_ = 0x7fffffff;
          auVar80._20_4_ = 0x7fffffff;
          auVar80._24_4_ = 0x7fffffff;
          auVar80._28_4_ = 0x7fffffff;
          local_2520 = vandps_avx(ZEXT1632(auVar75),auVar80);
          auVar76 = vcmpps_avx(ZEXT1632(auVar75),ZEXT832(0) << 0x20,4);
          auVar63 = vandps_avx(auVar76,auVar63);
          auVar62._0_4_ = local_2580._0_4_ + local_2560._0_4_;
          auVar62._4_4_ = local_2580._4_4_ + local_2560._4_4_;
          auVar62._8_4_ = local_2580._8_4_ + local_2560._8_4_;
          auVar62._12_4_ = local_2580._12_4_ + local_2560._12_4_;
          auVar62._16_4_ = fVar71 + fVar71;
          auVar62._20_4_ = fVar72 + fVar72;
          auVar62._24_4_ = fVar73 + fVar73;
          auVar62._28_4_ = fVar74 + fVar74;
          auVar76 = vcmpps_avx(auVar62,local_2520,2);
          auVar10 = auVar76 & auVar63;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            auVar63 = vandps_avx(auVar63,auVar76);
            auVar59 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
            auVar21._4_4_ = auVar14._4_4_ * fVar7;
            auVar21._0_4_ = auVar14._0_4_ * fVar3;
            auVar21._8_4_ = auVar14._8_4_ * fVar8;
            auVar21._12_4_ = auVar14._12_4_ * fVar9;
            auVar21._16_4_ = auVar14._16_4_ * 0.0;
            auVar21._20_4_ = auVar14._20_4_ * 0.0;
            auVar21._24_4_ = auVar14._24_4_ * 0.0;
            auVar21._28_4_ = auVar14._28_4_;
            auVar68 = vfmadd132ps_fma(auVar13,auVar21,ZEXT1632(auVar78));
            auVar68 = vfmadd132ps_fma(local_2660,ZEXT1632(auVar68),ZEXT1632(auVar60));
            local_2540._0_4_ = (float)(uVar44 ^ auVar68._0_4_);
            local_2540._4_4_ = (float)(uVar39 ^ auVar68._4_4_);
            local_2540._8_4_ = (float)(uVar40 ^ auVar68._8_4_);
            local_2540._12_4_ = (float)(uVar70 ^ auVar68._12_4_);
            local_2540._16_4_ = fVar71;
            local_2540._20_4_ = fVar72;
            local_2540._24_4_ = fVar73;
            local_2540._28_4_ = fVar74;
            fVar84 = *(float *)(ray + k * 4 + 0x30);
            auVar22._4_4_ = local_2520._4_4_ * fVar84;
            auVar22._0_4_ = local_2520._0_4_ * fVar84;
            auVar22._8_4_ = local_2520._8_4_ * fVar84;
            auVar22._12_4_ = local_2520._12_4_ * fVar84;
            auVar22._16_4_ = local_2520._16_4_ * fVar84;
            auVar22._20_4_ = local_2520._20_4_ * fVar84;
            auVar22._24_4_ = local_2520._24_4_ * fVar84;
            auVar22._28_4_ = fVar84;
            auVar63 = vcmpps_avx(auVar22,local_2540,1);
            fVar84 = *(float *)(ray + k * 4 + 0x80);
            auVar23._4_4_ = local_2520._4_4_ * fVar84;
            auVar23._0_4_ = local_2520._0_4_ * fVar84;
            auVar23._8_4_ = local_2520._8_4_ * fVar84;
            auVar23._12_4_ = local_2520._12_4_ * fVar84;
            auVar23._16_4_ = local_2520._16_4_ * fVar84;
            auVar23._20_4_ = local_2520._20_4_ * fVar84;
            auVar23._24_4_ = local_2520._24_4_ * fVar84;
            auVar23._28_4_ = fVar84;
            auVar76 = vcmpps_avx(local_2540,auVar23,2);
            auVar63 = vandps_avx(auVar63,auVar76);
            auVar68 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
            auVar59 = vpand_avx(auVar68,auVar59);
            auVar63 = vpmovzxwd_avx2(auVar59);
            auVar63 = vpslld_avx2(auVar63,0x1f);
            if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar63 >> 0x7f,0) != '\0') ||
                  (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar63 >> 0xbf,0) != '\0') ||
                (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar63[0x1f] < '\0') {
              local_24a0 = vpsrad_avx2(auVar63,0x1f);
              local_27e0 = auVar60._0_8_;
              uStack_27d8 = auVar60._8_8_;
              local_2500 = local_27e0;
              uStack_24f8 = uStack_27d8;
              uStack_24f0 = 0;
              uStack_24e8 = 0;
              local_27a0 = auVar78._0_8_;
              uStack_2798 = auVar78._8_8_;
              local_24e0 = local_27a0;
              uStack_24d8 = uStack_2798;
              uStack_24d0 = 0;
              uStack_24c8 = 0;
              local_2780 = auVar15._0_8_;
              uStack_2778 = auVar15._8_8_;
              local_24c0 = local_2780;
              uStack_24b8 = uStack_2778;
              uStack_24b0 = 0;
              uStack_24a8 = 0;
              local_23c0 = local_26a0;
              local_26e0 = local_24a0;
              auVar76 = vrcpps_avx(local_2520);
              auVar81._8_4_ = 0x3f800000;
              auVar81._0_8_ = 0x3f8000003f800000;
              auVar81._12_4_ = 0x3f800000;
              auVar81._16_4_ = 0x3f800000;
              auVar81._20_4_ = 0x3f800000;
              auVar81._24_4_ = 0x3f800000;
              auVar81._28_4_ = 0x3f800000;
              auVar68 = vfnmadd213ps_fma(local_2520,auVar76,auVar81);
              auVar68 = vfmadd132ps_fma(ZEXT1632(auVar68),auVar76,auVar76);
              fVar84 = auVar68._0_4_;
              fVar87 = auVar68._4_4_;
              auVar24._4_4_ = fVar87 * local_2540._4_4_;
              auVar24._0_4_ = fVar84 * local_2540._0_4_;
              fVar88 = auVar68._8_4_;
              auVar24._8_4_ = fVar88 * local_2540._8_4_;
              fVar89 = auVar68._12_4_;
              auVar24._12_4_ = fVar89 * local_2540._12_4_;
              auVar24._16_4_ = fVar71 * 0.0;
              auVar24._20_4_ = fVar72 * 0.0;
              auVar24._24_4_ = fVar73 * 0.0;
              auVar24._28_4_ = fVar74;
              local_2440 = auVar24;
              auVar25._4_4_ = fVar87 * local_2580._4_4_;
              auVar25._0_4_ = fVar84 * local_2580._0_4_;
              auVar25._8_4_ = fVar88 * local_2580._8_4_;
              auVar25._12_4_ = fVar89 * local_2580._12_4_;
              auVar25._16_4_ = fVar71 * 0.0;
              auVar25._20_4_ = fVar72 * 0.0;
              auVar25._24_4_ = fVar73 * 0.0;
              auVar25._28_4_ = fVar74;
              auVar76 = vminps_avx(auVar25,auVar81);
              auVar26._4_4_ = fVar87 * local_2560._4_4_;
              auVar26._0_4_ = fVar84 * local_2560._0_4_;
              auVar26._8_4_ = fVar88 * local_2560._8_4_;
              auVar26._12_4_ = fVar89 * local_2560._12_4_;
              auVar26._16_4_ = fVar71 * 0.0;
              auVar26._20_4_ = fVar72 * 0.0;
              auVar26._24_4_ = fVar73 * 0.0;
              auVar26._28_4_ = 0x3f800000;
              auVar10 = vminps_avx(auVar26,auVar81);
              auVar11 = vsubps_avx(auVar81,auVar76);
              auVar12 = vsubps_avx(auVar81,auVar10);
              local_2460 = vblendvps_avx(auVar10,auVar11,local_26a0);
              local_2480 = vblendvps_avx(auVar76,auVar12,local_26a0);
              local_27e0._0_4_ = auVar60._0_4_;
              local_27e0._4_4_ = auVar60._4_4_;
              uStack_27d8._0_4_ = auVar60._8_4_;
              uStack_27d8._4_4_ = auVar60._12_4_;
              local_27a0._0_4_ = auVar78._0_4_;
              local_27a0._4_4_ = auVar78._4_4_;
              uStack_2798._0_4_ = auVar78._8_4_;
              uStack_2798._4_4_ = auVar78._12_4_;
              local_2420[0] = (float)local_26c0._0_4_ * (float)local_27e0._0_4_;
              local_2420[1] = (float)local_26c0._4_4_ * (float)local_27e0._4_4_;
              local_2420[2] = fStack_26b8 * (float)uStack_27d8;
              local_2420[3] = fStack_26b4 * uStack_27d8._4_4_;
              fStack_2410 = fStack_26b0 * 0.0;
              fStack_240c = fStack_26ac * 0.0;
              fStack_2408 = fStack_26a8 * 0.0;
              uStack_2404 = local_2480._28_4_;
              local_2400[0] = (float)local_26c0._0_4_ * (float)local_27a0;
              local_2400[1] = (float)local_26c0._4_4_ * local_27a0._4_4_;
              local_2400[2] = fStack_26b8 * (float)uStack_2798;
              local_2400[3] = fStack_26b4 * uStack_2798._4_4_;
              fStack_23f0 = fStack_26b0 * 0.0;
              fStack_23ec = fStack_26ac * 0.0;
              fStack_23e8 = fStack_26a8 * 0.0;
              uStack_23e4 = local_2460._28_4_;
              local_23e0[0] = (float)local_26c0._0_4_ * fVar3;
              local_23e0[1] = (float)local_26c0._4_4_ * fVar7;
              local_23e0[2] = fStack_26b8 * fVar8;
              local_23e0[3] = fStack_26b4 * fVar9;
              fStack_23d0 = fStack_26b0 * 0.0;
              fStack_23cc = fStack_26ac * 0.0;
              fStack_23c8 = fStack_26a8 * 0.0;
              uStack_23c4 = auVar12._28_4_;
              auVar82._8_4_ = 0x7f800000;
              auVar82._0_8_ = 0x7f8000007f800000;
              auVar82._12_4_ = 0x7f800000;
              auVar82._16_4_ = 0x7f800000;
              auVar82._20_4_ = 0x7f800000;
              auVar82._24_4_ = 0x7f800000;
              auVar82._28_4_ = 0x7f800000;
              auVar63 = vblendvps_avx(auVar82,auVar24,auVar63);
              auVar76 = vshufps_avx(auVar63,auVar63,0xb1);
              auVar76 = vminps_avx(auVar63,auVar76);
              auVar10 = vshufpd_avx(auVar76,auVar76,5);
              auVar76 = vminps_avx(auVar76,auVar10);
              auVar10 = vpermpd_avx2(auVar76,0x4e);
              auVar76 = vminps_avx(auVar76,auVar10);
              auVar63 = vcmpps_avx(auVar76,auVar63,0);
              auVar68 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
              auVar59 = vpand_avx(auVar59,auVar68);
              auVar63 = vpmovzxwd_avx2(auVar59);
              auVar63 = vpslld_avx2(auVar63,0x1f);
              if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar63 >> 0x7f,0) == '\0') &&
                    (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar63 >> 0xbf,0) == '\0') &&
                  (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar63[0x1f]) {
                auVar63 = local_24a0;
              }
              uVar39 = vmovmskps_avx(auVar63);
              uVar44 = 0;
              for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x80000000) {
                uVar44 = uVar44 + 1;
              }
              uVar51 = (ulong)uVar44;
              pRVar6 = (context->scene->geometries).items;
              uVar39 = *(uint *)(ray + k * 4 + 0x90);
              uVar40 = *(uint *)((long)&local_2700 + uVar51 * 4);
              uVar70 = (pRVar6[uVar40].ptr)->mask;
              while ((uVar70 & uVar39) == 0) {
                *(undefined4 *)(local_26e0 + uVar51 * 4) = 0;
                if ((((((((local_26e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_26e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_26e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_26e0 >> 0x7f,0) == '\0') &&
                      (local_26e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_26e0 >> 0xbf,0) == '\0') &&
                    (local_26e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_26e0[0x1f]) goto LAB_005d978d;
                auVar63 = vblendvps_avx(auVar82,auVar24,local_26e0);
                auVar76 = vshufps_avx(auVar63,auVar63,0xb1);
                auVar76 = vminps_avx(auVar63,auVar76);
                auVar10 = vshufpd_avx(auVar76,auVar76,5);
                auVar76 = vminps_avx(auVar76,auVar10);
                auVar10 = vpermpd_avx2(auVar76,0x4e);
                auVar76 = vminps_avx(auVar76,auVar10);
                auVar76 = vcmpps_avx(auVar63,auVar76,0);
                auVar10 = local_26e0 & auVar76;
                auVar63 = local_26e0;
                if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar10 >> 0x7f,0) != '\0') ||
                      (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar10 >> 0xbf,0) != '\0') ||
                    (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar10[0x1f] < '\0') {
                  auVar63 = vandps_avx(auVar76,local_26e0);
                }
                uVar40 = vmovmskps_avx(auVar63);
                uVar44 = 0;
                for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x80000000) {
                  uVar44 = uVar44 + 1;
                }
                uVar51 = (ulong)uVar44;
                uVar40 = *(uint *)((long)&local_2700 + uVar51 * 4);
                uVar70 = (pRVar6[uVar40].ptr)->mask;
              }
              uVar51 = (ulong)(uVar44 << 2);
              uVar5 = *(undefined4 *)(local_2480 + uVar51);
              uVar4 = *(undefined4 *)(local_2460 + uVar51);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar51);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_2420 + uVar51);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_2400 + uVar51);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_23e0 + uVar51);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar5;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_25a0 + uVar51);
              *(uint *)(ray + k * 4 + 0x120) = uVar40;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
          }
LAB_005d978d:
          lVar55 = lVar55 + 1;
        } while (lVar55 != uVar54 - 8);
      }
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar86 = ZEXT3264(CONCAT428(uVar5,CONCAT424(uVar5,CONCAT420(uVar5,CONCAT416(uVar5,CONCAT412(
                                                  uVar5,CONCAT48(uVar5,CONCAT44(uVar5,uVar5))))))));
    }
    if (pauVar38 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }